

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O0

void cea708_parse_user_data_type_strcture(uint8_t *data,size_t size,user_data_t *user_data)

{
  bool bVar1;
  ushort *in_RDX;
  long in_RSI;
  byte *in_RDI;
  int i;
  int local_1c;
  ulong local_10;
  byte *local_8;
  
  memset(in_RDX,0,0x84);
  *in_RDX = *in_RDX & 0xfffe | (ushort)((*in_RDI & 0x80) != 0);
  *in_RDX = *in_RDX & 0xfffd | (ushort)((*in_RDI & 0x40) != 0) << 1;
  *in_RDX = *in_RDX & 0xfffb | (ushort)((*in_RDI & 0x20) != 0) << 2;
  *in_RDX = *in_RDX & 0xff07 | (*in_RDI & 0x1f) << 3;
  *in_RDX = *in_RDX & 0xff | (ushort)in_RDI[1] << 8;
  local_8 = in_RDI + 2;
  local_10 = in_RSI - 2;
  local_1c = 0;
  while( true ) {
    bVar1 = false;
    if (3 < local_10) {
      bVar1 = local_1c < (int)(uint)(*in_RDX >> 3 & 0x1f);
    }
    if (!bVar1) break;
    *(uint *)(in_RDX + (long)local_1c * 2 + 2) =
         *(uint *)(in_RDX + (long)local_1c * 2 + 2) & 0xffffffe0 | (int)(uint)*local_8 >> 3;
    *(uint *)(in_RDX + (long)local_1c * 2 + 2) =
         *(uint *)(in_RDX + (long)local_1c * 2 + 2) & 0xffffffdf |
         ((int)(uint)*local_8 >> 2 & 1U) << 5;
    *(uint *)(in_RDX + (long)local_1c * 2 + 2) =
         *(uint *)(in_RDX + (long)local_1c * 2 + 2) & 0xffffff3f | (*local_8 & 3) << 6;
    *(uint *)(in_RDX + (long)local_1c * 2 + 2) =
         *(uint *)(in_RDX + (long)local_1c * 2 + 2) & 0xff0000ff |
         (uint)CONCAT11(local_8[1],local_8[2]) << 8;
    local_1c = local_1c + 1;
    local_8 = local_8 + 3;
    local_10 = local_10 - 3;
  }
  return;
}

Assistant:

void cea708_parse_user_data_type_strcture(const uint8_t* data, size_t size, user_data_t* user_data)
{
    memset(user_data, 0, sizeof(user_data_t));
    user_data->process_em_data_flag = !!(data[0] & 0x80);
    user_data->process_cc_data_flag = !!(data[0] & 0x40);
    user_data->additional_data_flag = !!(data[0] & 0x20);
    user_data->cc_count = (data[0] & 0x1F);
    user_data->em_data = data[1];
    data += 2, size -= 2;

    for (int i = 0; 3 < size && i < (int)user_data->cc_count; ++i, data += 3, size -= 3) {
        user_data->cc_data[i].marker_bits = data[0] >> 3;
        user_data->cc_data[i].cc_valid = data[0] >> 2;
        user_data->cc_data[i].cc_type = data[0] >> 0;
        user_data->cc_data[i].cc_data = data[1] << 8 | data[2];
    }
}